

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O3

void destroyPath(Path *path)

{
  TileNode *__ptr;
  uint uVar1;
  uint uVar2;
  TileNode *pTVar3;
  
  uVar1 = path->count;
  if (uVar1 != 0) {
    uVar2 = 0;
    pTVar3 = path->first;
    do {
      while (__ptr = pTVar3->next, __ptr != (TileNode *)0x0) {
        free(__ptr);
        uVar1 = path->count - 1;
        path->count = uVar1;
        pTVar3 = __ptr;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  free(path);
  return;
}

Assistant:

void destroyPath(struct Path *path) {
    struct TileNode *nextNode = NULL;

    if (path->count > 0)
        nextNode = path->first;

    for (int i = 0; i < path->count; i++) {
        while (nextNode->next != NULL) {
            nextNode = nextNode->next;
            free(nextNode);
            path->count--;
        }
    }
    free(path);
}